

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O1

int cpu_exec_ppc(uc_struct_conflict10 *uc,CPUState_conflict *cpu)

{
  TranslationBlock_conflict **ppTVar1;
  uint32_t flags;
  void *pvVar2;
  CPUWatchpoint *pCVar3;
  CPUClass *pCVar4;
  long lVar5;
  void *pvVar6;
  _func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *p_Var7;
  _func_void_CPUState_ptr_vaddr_conflict *p_Var8;
  _Bool _Var9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  TranslationBlock_conflict *pTVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  TranslationBlock_conflict *pTVar17;
  TranslationBlock_conflict *pTVar18;
  uint uVar19;
  uint cf_mask;
  uint32_t cflags;
  CPUClass *pCVar20;
  TranslationBlock_conflict *pTVar21;
  uc_struct_conflict10 *puVar22;
  list_item *plVar23;
  bool bVar24;
  uc_tb cur_tb;
  ulong local_50;
  uint16_t local_48;
  uint16_t local_46;
  ulong local_40;
  uint16_t local_38;
  uint16_t local_36;
  
  pCVar20 = cpu->cc;
  if (cpu->halted != 0) {
    if (pCVar20->has_work == (_func__Bool_CPUState_ptr_conflict *)0x0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                 ,0x1bc,"cc->has_work");
    }
    _Var9 = (*pCVar20->has_work)(cpu);
    if (!_Var9) {
      return 0x10003;
    }
    cpu->halted = 0;
  }
  (*pCVar20->cpu_exec_enter)(cpu);
  iVar11 = __sigsetjmp(uc->exits + (long)uc->nested_level * 0x19 + 0x33,0);
  puVar22 = uc;
  if (iVar11 != 0) {
    pCVar20 = cpu->cc;
  }
  do {
    uVar16 = (uint)puVar22;
    puVar22 = cpu->uc;
    if ((puVar22->stop_interrupt == (uc_args_int_t_conflict10)0x0) ||
       (_Var9 = (*puVar22->stop_interrupt)(puVar22,cpu->exception_index), !_Var9)) {
      uVar19 = cpu->exception_index;
      if ((int)uVar19 < 0) {
        bVar24 = false;
      }
      else if ((int)uVar19 < 0x10000) {
        ppTVar1 = puVar22->cpu[1].tb_jmp_cache + 0x37b;
        *(int *)ppTVar1 = *(int *)ppTVar1 + 4;
        bVar24 = false;
        for (plVar23 = puVar22->hook[0].head;
            (plVar23 != (list_item *)0x0 && (pvVar2 = plVar23->data, pvVar2 != (void *)0x0));
            plVar23 = plVar23->next) {
          if (*(char *)((long)pvVar2 + 0x14) == '\0') {
            (**(code **)((long)pvVar2 + 0x28))
                      (puVar22,cpu->exception_index,*(undefined8 *)((long)pvVar2 + 0x30));
            bVar24 = true;
          }
        }
        if (bVar24) {
          cpu->exception_index = -1;
          uVar16 = 0x10000;
        }
        else {
          puVar22->invalid_error = 0x15;
          cpu->halted = 1;
          uVar16 = 0x10001;
        }
        bVar24 = (bool)(bVar24 ^ 1);
      }
      else {
        if (uVar19 == 0x10002) {
          pCVar4 = cpu->cc;
          if (cpu->watchpoint_hit == (CPUWatchpoint *)0x0) {
            for (pCVar3 = (cpu->watchpoints).tqh_first; pCVar3 != (CPUWatchpoint *)0x0;
                pCVar3 = (pCVar3->entry).tqe_next) {
              *(byte *)&pCVar3->flags = (byte)pCVar3->flags & 0x3f;
            }
          }
          (*pCVar4->debug_excp_handler)(cpu);
        }
        cpu->exception_index = -1;
        bVar24 = true;
        uVar16 = uVar19;
      }
    }
    else {
      plVar23 = puVar22->hook[0xe].head;
      if (plVar23 == (list_item *)0x0) {
LAB_00a8cc80:
        puVar22->invalid_error = 10;
      }
      else {
        bVar10 = 0;
        while (pvVar2 = plVar23->data, pvVar2 != (void *)0x0) {
          if (((*(char *)((long)pvVar2 + 0x14) == '\0') &&
              (bVar10 = (**(code **)((long)pvVar2 + 0x28))
                                  (puVar22,*(undefined8 *)((long)pvVar2 + 0x30)), bVar10 != 0)) ||
             (plVar23 = plVar23->next, plVar23 == (list_item *)0x0)) break;
        }
        if ((bVar10 & 1) == 0) goto LAB_00a8cc80;
      }
      bVar24 = true;
      uVar16 = 0x10001;
    }
    if (bVar24) {
      uc->cpu->tcg_exit_req = 0;
      (*pCVar20->cpu_exec_exit)(cpu);
      return uVar16;
    }
    pTVar18 = (TranslationBlock_conflict *)0x0;
    pTVar17 = pTVar18;
LAB_00a8cd9e:
    pCVar4 = cpu->cc;
    *(undefined2 *)((long)cpu[1].tb_jmp_cache + 0x1a6a) = 0;
    uVar19 = cpu->interrupt_request;
    if (uVar19 == 0) {
LAB_00a8cdb9:
      if (cpu->exit_request == true) {
        cpu->exit_request = false;
        bVar24 = true;
        if (cpu->exception_index == -1) {
          cpu->exception_index = 0x10000;
        }
      }
      else {
        bVar24 = false;
      }
    }
    else {
      uVar12 = uVar19;
      if ((cpu->singlestep_enabled & 2) != 0) {
        uVar12 = uVar19 & 0xffffeda5;
      }
      if ((char)uVar12 < '\0') {
        cpu->interrupt_request = uVar19 & 0xffffff7f;
        cpu->exception_index = 0x10002;
      }
      else {
        if ((uVar12 >> 10 & 1) == 0) {
          _Var9 = (*pCVar4->cpu_exec_interrupt)(cpu,uVar12);
          if (_Var9) {
            cpu->exception_index = -1;
            pTVar17 = (TranslationBlock_conflict *)0x0;
          }
          if ((cpu->interrupt_request & 4) != 0) {
            cpu->interrupt_request = cpu->interrupt_request & 0xfffffffb;
            pTVar17 = (TranslationBlock_conflict *)0x0;
          }
          goto LAB_00a8cdb9;
        }
        cpu_reset((CPUState *)cpu);
      }
      bVar24 = true;
    }
    if (!bVar24) {
      cflags = cpu->cflags_next_tb;
      if (cflags == 0xffffffff) {
        cflags = 0;
      }
      else {
        cpu->cflags_next_tb = 0xffffffff;
      }
      puVar22 = cpu->uc;
      uVar19 = *(uint *)((long)cpu->env_ptr + 0x160);
      flags = *(uint32_t *)((long)cpu->env_ptr + 0x118fc);
      uVar12 = uVar19 >> 6 ^ uVar19;
      uVar12 = uVar12 & 0x3f | uVar12 >> 6 & 0xfc0;
      pTVar13 = cpu->tb_jmp_cache[uVar12];
      cf_mask = cpu->cluster_index << 0x18 | cflags & 0xffffff;
      if ((((pTVar13 == (TranslationBlock_conflict *)0x0) || (pTVar13->pc != uVar19)) ||
          ((pTVar13->cs_base != 0 ||
           ((pTVar13->flags != flags || (cpu->trace_dstate[0] != (ulong)pTVar13->trace_vcpu_dstate))
           )))) || ((pTVar13->cflags & 0xff0effff) != cf_mask)) {
        pTVar13 = tb_htable_lookup_ppc(cpu,uVar19,0,flags,cf_mask);
        if (pTVar13 == (TranslationBlock_conflict *)0x0) {
          pTVar13 = (TranslationBlock_conflict *)0x0;
        }
        else {
          cpu->tb_jmp_cache[uVar12] = pTVar13;
        }
      }
      if (pTVar13 == (TranslationBlock_conflict *)0x0) {
        pTVar13 = tb_gen_code_ppc(cpu,uVar19,0,flags,cflags);
        cpu->tb_jmp_cache[uVar12] = pTVar13;
        pTVar21 = puVar22->last_tb;
        if (pTVar21 != (TranslationBlock_conflict *)0x0) {
          local_40 = (ulong)pTVar13->pc;
          local_38 = pTVar13->icount;
          local_36 = pTVar13->size;
          local_50 = (ulong)pTVar21->pc;
          local_48 = pTVar21->icount;
          local_46 = pTVar21->size;
          for (plVar23 = puVar22->hook[0xf].head;
              (plVar23 != (list_item *)0x0 && (pvVar2 = plVar23->data, pvVar2 != (void *)0x0));
              plVar23 = plVar23->next) {
            if (*(char *)((long)pvVar2 + 0x14) == '\0') {
              if (((*(ulong *)((long)pvVar2 + 0x18) <= (ulong)pTVar13->pc) &&
                  ((ulong)pTVar13->pc <= *(ulong *)((long)pvVar2 + 0x20))) ||
                 (*(ulong *)((long)pvVar2 + 0x20) < *(ulong *)((long)pvVar2 + 0x18))) {
                (**(code **)((long)pvVar2 + 0x28))
                          (puVar22,&local_40,&local_50,*(undefined8 *)((long)pvVar2 + 0x30));
              }
            }
          }
        }
      }
      if ((pTVar17 != (TranslationBlock_conflict *)0x0) &&
         (pTVar13->page_addr[1] == 0xffffffffffffffff)) {
        if (1 < (uint)pTVar18) {
          __assert_fail("n < ARRAY_SIZE(tb->jmp_list_next)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                        ,0xda,"void tb_add_jump(TranslationBlock *, int, TranslationBlock *)");
        }
        if ((pTVar13->cflags & 0x40000) == 0) {
          LOCK();
          bVar24 = pTVar17->jmp_dest[(long)pTVar18] == 0;
          if (bVar24) {
            pTVar17->jmp_dest[(long)pTVar18] = (uintptr_t)pTVar13;
          }
          UNLOCK();
          if (bVar24) {
            pvVar2 = (pTVar17->tc).ptr;
            *(int *)(pTVar17->jmp_target_arg[(long)pTVar18] + (long)pvVar2) =
                 (*(int *)&(pTVar13->tc).ptr -
                 ((int)pTVar17->jmp_target_arg[(long)pTVar18] + (int)pvVar2)) + -4;
            pTVar17->jmp_list_next[(long)pTVar18] = pTVar13->jmp_list_head;
            pTVar13->jmp_list_head = (ulong)pTVar17 | (ulong)pTVar18;
          }
        }
      }
      if (cpu->exit_request == false) {
        pvVar2 = cpu->env_ptr;
        tb_exec_lock_ppc(cpu->uc->tcg_ctx);
        uVar14 = (**(code **)(*(long *)(*(long *)((long)pvVar2 + 0x11e00) + 0x2e8) + 0x90))(pvVar2);
        if (cpu->uc->nested_level == 1) {
          tb_exec_unlock_ppc(cpu->uc->tcg_ctx);
        }
        cpu->can_do_io = 1;
        pTVar21 = (TranslationBlock_conflict *)(uVar14 & 0xfffffffffffffffc);
        if ((uVar14 & 2) != 0) {
          if (*(long *)(*(long *)((long)pvVar2 + 0x11e00) + 0x358) == 0) {
            uVar19 = *(uint *)(*(long *)((long)pvVar2 + 0x11e00) + 0x578);
            if (((0x12 < uVar19) || ((0x771c0U >> (uVar19 & 0x1f) & 1) == 0)) &&
               (cpu->uc->quit_request == false)) {
              p_Var7 = cpu->cc->synchronize_from_tb;
              if (p_Var7 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
                p_Var8 = cpu->cc->set_pc;
                if (p_Var8 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) goto LAB_00a8d3ae;
                (*p_Var8)(cpu,(ulong)pTVar21->pc);
              }
              else {
                (*p_Var7)(cpu,pTVar21);
              }
            }
          }
          cpu->tcg_exit_req = 0;
        }
        cpu->uc->last_tb = pTVar13;
        uVar19 = (uint)uVar14 & 3;
        pTVar18 = (TranslationBlock_conflict *)(ulong)uVar19;
        pTVar17 = pTVar21;
        if (uVar19 == 3) {
          pTVar17 = (TranslationBlock_conflict *)0x0;
          pTVar18 = (TranslationBlock_conflict *)0x3;
          if (-1 < *(int *)(cpu[1].tb_jmp_cache + 0x34d)) {
            lVar5 = cpu->icount_budget;
            lVar15 = 0xffff;
            if (lVar5 < 0xffff) {
              lVar15 = lVar5;
            }
            uVar19 = (uint)lVar15;
            *(short *)(cpu[1].tb_jmp_cache + 0x34d) = (short)lVar15;
            cpu->icount_extra = lVar5 - (int)uVar19;
            pTVar17 = (TranslationBlock_conflict *)0x0;
            pTVar18 = (TranslationBlock_conflict *)0x3;
            if (0 < (int)uVar19 && lVar5 - (int)uVar19 == 0) {
              uVar12 = 0x7fff;
              if ((int)uVar19 < 0x7fff) {
                uVar12 = uVar19;
              }
              pTVar17 = tb_gen_code_ppc(cpu,pTVar21->pc,pTVar21->cs_base,pTVar21->flags,
                                        uVar12 | 0x10000);
              pTVar17->orig_tb = pTVar21;
              pvVar2 = cpu->env_ptr;
              pvVar6 = (pTVar17->tc).ptr;
              tb_exec_lock_ppc(cpu->uc->tcg_ctx);
              uVar14 = (**(code **)(*(long *)(*(long *)((long)pvVar2 + 0x11e00) + 0x2e8) + 0x90))
                                 (pvVar2,pvVar6);
              if (cpu->uc->nested_level == 1) {
                tb_exec_unlock_ppc(cpu->uc->tcg_ctx);
              }
              cpu->can_do_io = 1;
              if ((uVar14 & 2) != 0) {
                if (*(long *)(*(long *)((long)pvVar2 + 0x11e00) + 0x358) == 0) {
                  uVar19 = *(uint *)(*(long *)((long)pvVar2 + 0x11e00) + 0x578);
                  if (((0x12 < uVar19) || ((0x771c0U >> (uVar19 & 0x1f) & 1) == 0)) &&
                     (cpu->uc->quit_request == false)) {
                    p_Var7 = cpu->cc->synchronize_from_tb;
                    if (p_Var7 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
                      p_Var8 = cpu->cc->set_pc;
                      if (p_Var8 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) {
LAB_00a8d3ae:
                        __assert_fail("cc->set_pc",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                                      ,0x61,
                                      "tcg_target_ulong cpu_tb_exec(CPUState *, TranslationBlock *)"
                                     );
                      }
                      (*p_Var8)(cpu,(ulong)((TranslationBlock_conflict *)
                                           (uVar14 & 0xfffffffffffffffc))->pc);
                    }
                    else {
                      (*p_Var7)(cpu,(TranslationBlock_conflict *)(uVar14 & 0xfffffffffffffffc));
                    }
                  }
                }
                cpu->tcg_exit_req = 0;
              }
              tb_phys_invalidate_ppc(cpu->uc->tcg_ctx,pTVar17,0xffffffffffffffff);
              tcg_tb_remove_ppc(cpu->uc->tcg_ctx,pTVar17);
              pTVar17 = (TranslationBlock_conflict *)0x0;
              pTVar18 = (TranslationBlock_conflict *)0x3;
            }
          }
        }
      }
      goto LAB_00a8cd9e;
    }
    puVar22 = (uc_struct_conflict10 *)(ulong)uVar16;
  } while( true );
}

Assistant:

int cpu_exec(struct uc_struct *uc, CPUState *cpu)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
    int ret;
    // SyncClocks sc = { 0 };

    if (cpu_handle_halt(cpu)) {
        return EXCP_HALTED;
    }

    // rcu_read_lock();

    cc->cpu_exec_enter(cpu);

    /* Calculate difference between guest clock and host clock.
     * This delay includes the delay of the last cycle, so
     * what we have to do is sleep until it is 0. As for the
     * advance/delay we gain here, we try to fix it next time.
     */
    // init_delay_params(&sc, cpu);

    // Unicorn: We would like to support nested uc_emu_start calls.
    /* prepare setjmp context for exception handling */
    // if (sigsetjmp(cpu->jmp_env, 0) != 0) {
    if (sigsetjmp(uc->jmp_bufs[uc->nested_level - 1], 0) != 0) {
#if defined(__clang__) || !QEMU_GNUC_PREREQ(4, 6)
        /* Some compilers wrongly smash all local variables after
         * siglongjmp. There were bug reports for gcc 4.5.0 and clang.
         * Reload essential local variables here for those compilers.
         * Newer versions of gcc would complain about this code (-Wclobbered). */
        cc = CPU_GET_CLASS(cpu);
#else /* buggy compiler */
        /* Assert that the compiler does not smash local variables. */
        // g_assert(cpu == current_cpu);
        g_assert(cc == CPU_GET_CLASS(cpu));
#endif /* buggy compiler */

        assert_no_pages_locked();
    }

    /* if an exception is pending, we execute it here */
    while (!cpu_handle_exception(cpu, &ret)) {
        TranslationBlock *last_tb = NULL;
        int tb_exit = 0;

        while (!cpu_handle_interrupt(cpu, &last_tb)) {
            uint32_t cflags = cpu->cflags_next_tb;
            TranslationBlock *tb;

            /* When requested, use an exact setting for cflags for the next
               execution.  This is used for icount, precise smc, and stop-
               after-access watchpoints.  Since this request should never
               have CF_INVALID set, -1 is a convenient invalid value that
               does not require tcg headers for cpu_common_reset.  */
            if (cflags == -1) {
                cflags = curr_cflags();
            } else {
                cpu->cflags_next_tb = -1;
            }

            tb = tb_find(cpu, last_tb, tb_exit, cflags);
            if (unlikely(cpu->exit_request)) {
                continue;
            }
            cpu_loop_exec_tb(cpu, tb, &last_tb, &tb_exit);
            /* Try to align the host and virtual clocks
               if the guest is in advance */
            // align_clocks(&sc, cpu);
        }
    }

    // Unicorn: Clear any TCG exit flag that might have been left set by exit requests
    uc->cpu->tcg_exit_req = 0;

    cc->cpu_exec_exit(cpu);
    // rcu_read_unlock();

    return ret;
}